

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O2

void __thiscall
soul::SourceCodeOperations::deleteText
          (SourceCodeOperations *this,CodeLocation *start,CodeLocation *end)

{
  CodeLocation local_48;
  CodeLocation local_38;
  string local_28;
  
  local_48.sourceCode.object = (start->sourceCode).object;
  if (local_48.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_48.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_48.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_48.location.data = (start->location).data;
  local_38.sourceCode.object = (end->sourceCode).object;
  if (local_38.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_38.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_38.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_38.location.data = (end->location).data;
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  replaceText(this,&local_48,&local_38,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_38.sourceCode);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_48.sourceCode);
  return;
}

Assistant:

void SourceCodeOperations::addProcessor (AST::ProcessorBase&)
{
    // TODO
}